

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::anon_unknown_1::CoordVertexShader::shadeVertices
          (CoordVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  Vec4 position;
  Vector<float,_4> local_58;
  Vector<float,_4> local_40;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pVVar1 = packets[uVar3];
    tcu::Vector<float,_4>::Vector(&local_40);
    rr::readVertexAttrib(&local_40,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
    tcu::Vector<float,_4>::Vector(&local_58,1.0);
    *(undefined8 *)&pVVar1->outputs[0].v = local_58.m_data._0_8_;
    *(undefined8 *)((long)&pVVar1->outputs[0].v + 8) = local_58.m_data._8_8_;
    fVar4 = local_40.m_data[0] + -0.5;
    fVar5 = local_40.m_data[1] + -0.5;
    (pVVar1->position).m_data[0] = fVar4 + fVar4;
    (pVVar1->position).m_data[1] = fVar5 + fVar5;
    (pVVar1->position).m_data[2] = 0.0;
    (pVVar1->position).m_data[3] = 1.0;
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::VertexPacket* const		packet		= packets[packetNdx];
			tcu::Vec4					position;

			readVertexAttrib(position, inputs[0], packet->instanceNdx, packet->vertexNdx);

			packet->outputs[0]	= tcu::Vec4(1.0f);
			packet->position	= tcu::Vec4(2.0f * (position.x() - 0.5f), 2.0f * (position.y() - 0.5f), 0.0f, 1.0f);
		}
	}